

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O2

void __thiscall BS::thread_pool::create_threads(thread_pool *this)

{
  concurrency_t i;
  ulong uVar1;
  long lVar2;
  thread_pool *local_50;
  code *local_48;
  undefined8 local_40;
  thread local_38;
  
  LOCK();
  (this->running)._M_base._M_i = true;
  UNLOCK();
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < this->thread_count; uVar1 = uVar1 + 1) {
    local_48 = worker;
    local_40 = 0;
    local_50 = this;
    std::thread::thread<void(BS::thread_pool::*)(),BS::thread_pool*,void>
              (&local_38,(type *)&local_48,&local_50);
    std::thread::operator=
              ((thread *)
               ((long)&(((this->threads)._M_t.
                         super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
                         super__Head_base<0UL,_std::thread_*,_false>._M_head_impl)->_M_id)._M_thread
               + lVar2),&local_38);
    std::thread::~thread(&local_38);
    lVar2 = lVar2 + 8;
  }
  return;
}

Assistant:

void create_threads()
    {
        running = true;
        for (concurrency_t i = 0; i < thread_count; ++i)
        {
            threads[i] = std::thread(&thread_pool::worker, this);
        }
    }